

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

int maxdirsterid<cbtVector3>
              (cbtVector3 *p,int count,cbtVector3 *dir,cbtAlignedObjectArray<int> *allow)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int unaff_EBP;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [64];
  cbtVector3 cVar20;
  int local_b4;
  int local_a0;
  cbtVector3 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar16 [56];
  undefined1 auVar19 [56];
  
  do {
    auVar19 = in_ZMM1._8_56_;
    auVar16 = in_ZMM0._8_56_;
    iVar8 = maxdirfiltered<cbtVector3>(p,count,dir,allow);
    if (allow->m_data[iVar8] == 3) {
      return iVar8;
    }
    cVar20 = orth(dir);
    auVar18._0_8_ = cVar20.m_floats._8_8_;
    auVar18._8_56_ = auVar19;
    auVar15._0_8_ = cVar20.m_floats._0_8_;
    auVar15._8_56_ = auVar16;
    local_48 = auVar15._0_16_;
    local_68 = vmovshdup_avx(local_48);
    auVar3 = vfmsub231ss_fma(ZEXT416((uint)(dir->m_floats[1] * cVar20.m_floats[2])),local_68,
                             ZEXT416((uint)dir->m_floats[2]));
    local_58 = auVar18._0_16_;
    auVar4 = vfmsub231ss_fma(ZEXT416((uint)(dir->m_floats[2] * cVar20.m_floats[0])),
                             ZEXT416((uint)dir->m_floats[0]),local_58);
    auVar5 = vfmsub231ss_fma(ZEXT416((uint)(dir->m_floats[0] * local_68._0_4_)),local_48,
                             ZEXT416((uint)dir->m_floats[1]));
    local_b4 = -1;
    in_ZMM1 = ZEXT864(0) << 0x20;
    bVar1 = false;
    do {
      fVar17 = in_ZMM1._0_4_;
      fVar12 = sinf(fVar17 * 0.017453292);
      fVar13 = cosf(fVar17 * 0.017453292);
      auVar2 = vinsertps_avx(ZEXT416((uint)((fVar12 * (float)local_48._0_4_ + fVar13 * auVar3._0_4_)
                                            * 0.025 + dir->m_floats[0])),
                             ZEXT416((uint)((fVar12 * (float)local_68._0_4_ + fVar13 * auVar4._0_4_)
                                            * 0.025 + dir->m_floats[1])),0x10);
      local_78.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar2,ZEXT416((uint)((fVar12 * (float)local_58._0_4_ +
                                               fVar13 * auVar5._0_4_) * 0.025 + dir->m_floats[2])),
                         0x28);
      in_ZMM0 = ZEXT1664((undefined1  [16])local_78.m_floats);
      iVar9 = maxdirfiltered<cbtVector3>(p,count,&local_78,allow);
      if (iVar9 == iVar8 && local_b4 == iVar8) {
        allow->m_data[iVar8] = 3;
        bVar11 = false;
        unaff_EBP = iVar8;
      }
      else if (local_b4 == iVar9 || local_b4 == -1) {
        bVar11 = true;
        local_b4 = iVar9;
      }
      else {
        fVar12 = fVar17 + -40.0;
        bVar11 = true;
        iVar7 = local_b4;
        while( true ) {
          bVar6 = fVar17 < fVar12;
          in_ZMM0 = ZEXT464((uint)fVar12);
          local_a0 = unaff_EBP;
          if (bVar6) break;
          fVar13 = sinf(fVar12 * 0.017453292);
          fVar14 = cosf(fVar12 * 0.017453292);
          auVar2 = vinsertps_avx(ZEXT416((uint)((fVar13 * (float)local_48._0_4_ +
                                                fVar14 * auVar3._0_4_) * 0.025 + dir->m_floats[0])),
                                 ZEXT416((uint)((fVar13 * (float)local_68._0_4_ +
                                                fVar14 * auVar4._0_4_) * 0.025 + dir->m_floats[1])),
                                 0x10);
          local_78.m_floats =
               (cbtScalar  [4])
               vinsertps_avx(auVar2,ZEXT416((uint)((fVar13 * (float)local_58._0_4_ +
                                                   fVar14 * auVar5._0_4_) * 0.025 + dir->m_floats[2]
                                                  )),0x28);
          in_ZMM0 = ZEXT1664((undefined1  [16])local_78.m_floats);
          iVar10 = maxdirfiltered<cbtVector3>(p,count,&local_78,allow);
          bVar11 = iVar10 != iVar8 || iVar7 != iVar8;
          if (iVar10 == iVar8 && iVar7 == iVar8) {
            allow->m_data[iVar8] = 3;
            local_a0 = iVar8;
            break;
          }
          fVar12 = fVar12 + 5.0;
          iVar7 = iVar10;
        }
        if (bVar6) {
          local_b4 = iVar9;
        }
        bVar11 = (bool)(bVar11 | bVar6);
        unaff_EBP = local_a0;
      }
      in_ZMM1 = ZEXT464((uint)fVar17);
      if (!bVar11) break;
      in_ZMM1 = ZEXT464((uint)(fVar17 + 45.0));
      in_ZMM0 = ZEXT464(0x43b40000);
      bVar1 = 360.0 < fVar17 + 45.0;
    } while (!bVar1);
    if (!bVar1) {
      return unaff_EBP;
    }
    allow->m_data[iVar8] = 0;
  } while( true );
}

Assistant:

int maxdirsterid(const T *p, int count, const T &dir, cbtAlignedObjectArray<int> &allow)
{
	int m = -1;
	while (m == -1)
	{
		m = maxdirfiltered(p, count, dir, allow);
		if (allow[m] == 3) return m;
		T u = orth(dir);
		T v = cbtCross(u, dir);
		int ma = -1;
		for (cbtScalar x = cbtScalar(0.0); x <= cbtScalar(360.0); x += cbtScalar(45.0))
		{
			cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (x));
			cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (x));
			int mb = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
			if (ma == m && mb == m)
			{
				allow[m] = 3;
				return m;
			}
			if (ma != -1 && ma != mb)  // Yuck - this is really ugly
			{
				int mc = ma;
				for (cbtScalar xx = x - cbtScalar(40.0); xx <= x; xx += cbtScalar(5.0))
				{
					cbtScalar s = cbtSin(SIMD_RADS_PER_DEG * (xx));
					cbtScalar c = cbtCos(SIMD_RADS_PER_DEG * (xx));
					int md = maxdirfiltered(p, count, dir + (u * s + v * c) * cbtScalar(0.025), allow);
					if (mc == m && md == m)
					{
						allow[m] = 3;
						return m;
					}
					mc = md;
				}
			}
			ma = mb;
		}
		allow[m] = 0;
		m = -1;
	}
	cbtAssert(0);
	return m;
}